

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AList.hpp
# Opt level: O3

ostream * operator<<(ostream *stream,ItemInfo *ref)

{
  size_t sVar1;
  char *__s;
  double dVar2;
  
  switch((ref->m_value).type) {
  case IVT_BOOL:
    std::ostream::_M_insert<bool>(SUB81(stream,0));
    break;
  case IVT_INT:
    std::ostream::operator<<((ostream *)stream,(ref->m_value).field_3.iValue);
    break;
  case IVT_FLOAT:
    dVar2 = (double)(ref->m_value).field_3.fValue;
    goto LAB_00105797;
  case IVT_DOUBLE:
    dVar2 = (ref->m_value).field_3.eValue;
LAB_00105797:
    std::ostream::_M_insert<double>(dVar2);
    break;
  case IVT_STRING:
    __s = (ref->m_value).field_3.sValue;
    if (__s == (char *)0x0) {
      std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
      return stream;
    }
    sVar1 = strlen(__s);
    goto LAB_001057cb;
  case IVT_LIST:
    __s = "[List]";
    sVar1 = 6;
    goto LAB_001057cb;
  case IVT_OBJECT:
    __s = "[Object]";
    sVar1 = 8;
LAB_001057cb:
    std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar1);
  }
  return stream;
}

Assistant:

inline ostream& operator << (ostream &stream, ItemInfo& ref)
        {
            switch (ref.get_type())
            {
                case IVT_BOOL:
                {
                    stream << ref.get_value().bValue;
                }
                break;

                case IVT_INT:
                {
                    stream << ref.get_value().iValue;
                }
                break;

                case IVT_FLOAT:
                {
                    stream << ref.get_value().fValue;
                }
                break;

                case IVT_DOUBLE:
                {
                    stream << ref.get_value().eValue;
                }
                break;

                case IVT_STRING:
                {
                    stream << ref.get_value().sValue;
                }
                break;

                case IVT_LIST:
                {
                    stream << "[List]";
                }
                break;

                case IVT_OBJECT:
                {
                    stream << "[Object]";
                }
                break;

                default:
                {
                }
                break;
            }

            return stream;
        }